

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O2

vector<char8_t,_std::allocator<char8_t>_> *
make_word<char8_t,std::vector<char8_t,std::allocator<char8_t>>>
          (vector<char8_t,_std::allocator<char8_t>_> *__return_storage_ptr__,size_t length,
          char8_t delim)

{
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 1;
  local_28.field_2._M_local_buf[1] = '\0';
  local_28.field_2._M_local_buf[0] = delim;
  make_word<char8_t,_std::vector<char8_t,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            (__return_storage_ptr__,&local_28,length);
  std::__cxx11::u8string::~u8string((u8string *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

ResultT make_word(size_t length = 8, T delim = default_delim<T>) {
	return make_word<T, ResultT>(std::basic_string<T>{ delim }, length);
}